

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

void __thiscall Js::JITPageAddrToFuncRangeCache::ClearCache(JITPageAddrToFuncRangeCache *this)

{
  JITPageAddrToFuncRangeCache *this_local;
  
  if (this->jitPageAddrToFuncRangeMap != (JITPageAddrToFuncRangeMap *)0x0) {
    JsUtil::
    BaseDictionary<void*,JsUtil::BaseDictionary<void*,unsigned_int,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>*,Memory::HeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::Map<Js::JITPageAddrToFuncRangeCache::ClearCache()::__0>
              ((BaseDictionary<void*,JsUtil::BaseDictionary<void*,unsigned_int,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>*,Memory::HeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)this->jitPageAddrToFuncRangeMap);
    Memory::
    DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,JsUtil::BaseDictionary<void*,JsUtil::BaseDictionary<void*,unsigned_int,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>*,Memory::HeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>>
              (&Memory::HeapAllocator::Instance,this->jitPageAddrToFuncRangeMap);
    this->jitPageAddrToFuncRangeMap = (JITPageAddrToFuncRangeMap *)0x0;
  }
  if (this->largeJitFuncToSizeMap != (LargeJITFuncAddrToSizeMap *)0x0) {
    Memory::
    DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,JsUtil::BaseDictionary<void*,unsigned_int,Memory::HeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>>
              (&Memory::HeapAllocator::Instance,this->largeJitFuncToSizeMap);
    this->largeJitFuncToSizeMap = (LargeJITFuncAddrToSizeMap *)0x0;
  }
  return;
}

Assistant:

void JITPageAddrToFuncRangeCache::ClearCache()
    {
        if (jitPageAddrToFuncRangeMap != nullptr)
        {
            jitPageAddrToFuncRangeMap->Map(
                [](void* key, RangeMap* value) {
                HeapDelete(value);
            });

            HeapDelete(jitPageAddrToFuncRangeMap);
            jitPageAddrToFuncRangeMap = nullptr;
        }

        if (largeJitFuncToSizeMap != nullptr)
        {
            HeapDelete(largeJitFuncToSizeMap);
            largeJitFuncToSizeMap = nullptr;
        }
    }